

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

ON_SubD_ComponentIdTypeAndTag
ON_SubD_ComponentIdTypeAndTag::CreateFromEdgeId
          (uint edge_id,ON_SubDEdgeTag etag,ON_SubDEdgeSharpness sharpness)

{
  ON_SubDEdgeTag OVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined3 in_register_00000031;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  ON_SubD_ComponentIdTypeAndTag OVar5;
  float local_38;
  float fStack_34;
  ON_SubD_ComponentIdTypeAndTag local_28;
  undefined1 local_18 [16];
  
  local_38 = 0.0;
  fStack_34 = 0.0;
  uVar2 = 1;
  if (CONCAT31(in_register_00000031,etag) != 4) {
    uVar2 = (uint)(etag & (SmoothX|Crease|Smooth));
  }
  uVar3 = 0;
  if (edge_id != 0) {
    uVar3 = (ulong)uVar2 << 0x28 | 0x400000000;
  }
  uVar4 = edge_id | uVar3;
  local_28.m_sharpness = (ON_SubDEdgeSharpness)(float  [2])0x0;
  if ((uVar3 >> 0x22 & 1) != 0) {
    local_18._8_4_ = in_XMM0_Dc;
    local_18._0_8_ = sharpness.m_edge_sharpness;
    local_18._12_4_ = in_XMM0_Dd;
    local_28._8_8_ = uVar4;
    OVar1 = EdgeTag(&local_28);
    local_38 = 0.0;
    fStack_34 = 0.0;
    if ((OVar1 == SmoothX) || (OVar1 == Smooth)) {
      if ((0.0 <= (float)local_18._0_4_) &&
         (((0.0 < (float)local_18._0_4_ || 0.0 < (float)local_18._4_4_ &&
           ((float)local_18._0_4_ <= 4.0)) && (0.0 <= (float)local_18._4_4_)))) {
        if ((float)local_18._4_4_ <= 4.0) {
          local_38 = (float)local_18._0_4_;
          fStack_34 = (float)local_18._4_4_;
        }
        goto LAB_005c6f1e;
      }
    }
    local_38 = 0.0;
    fStack_34 = 0.0;
  }
LAB_005c6f1e:
  OVar5.m_sharpness.m_edge_sharpness[1] = fStack_34;
  OVar5.m_sharpness.m_edge_sharpness[0] = local_38;
  OVar5.m_id = (int)uVar4;
  OVar5.m_type = (char)(uVar4 >> 0x20);
  OVar5.m_tag_and_dirx = (char)(uVar4 >> 0x28);
  OVar5.m_reserved = (short)(uVar4 >> 0x30);
  return OVar5;
}

Assistant:

const ON_SubD_ComponentIdTypeAndTag ON_SubD_ComponentIdTypeAndTag::CreateFromEdgeId(unsigned edge_id, ON_SubDEdgeTag etag, ON_SubDEdgeSharpness sharpness)
{
  ON_SubD_ComponentIdTypeAndTag itt = CreateFromEdgeId(edge_id, etag);
  if (ON_SubDComponentPtr::Type::Edge == itt.m_type)
  {
    switch (itt.EdgeTag())
    {
    case ON_SubDEdgeTag::Smooth:
    case ON_SubDEdgeTag::SmoothX:
      if (sharpness.IsSharp())
        itt.m_sharpness = sharpness;
      break;
    default:
      break;
    }
  }
  return itt;
}